

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O3

void mp_mul_integer_into(mp_int *r,mp_int *a,uint16_t n)

{
  size_t sVar1;
  ulong uVar2;
  BignumInt *pBVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ulong uVar6;
  ulong uVar7;
  
  sVar1 = r->nw;
  if (sVar1 != 0) {
    uVar2 = a->nw;
    pBVar3 = r->w;
    uVar6 = 0;
    uVar7 = 0;
    do {
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar6;
      if (uVar7 < uVar2) {
        uVar6 = a->w[uVar7];
      }
      else {
        uVar6 = 0;
      }
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar6;
      auVar5 = auVar4 * ZEXT216(n) + auVar5;
      uVar6 = auVar5._8_8_;
      pBVar3[uVar7] = auVar5._0_8_;
      uVar7 = uVar7 + 1;
    } while (sVar1 != uVar7);
    if (uVar6 != 0) {
      __assert_fail("!carry",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/mpint.c"
                    ,0x360,"void mp_mul_integer_into(mp_int *, mp_int *, uint16_t)");
    }
  }
  return;
}

Assistant:

void mp_mul_integer_into(mp_int *r, mp_int *a, uint16_t n)
{
    BignumInt carry = 0, mult = n;
    for (size_t i = 0; i < r->nw; i++) {
        BignumInt aword = mp_word(a, i);
        BignumMULADD(carry, r->w[i], aword, mult, carry);
    }
    assert(!carry);
}